

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit_state.cpp
# Opt level: O2

void __thiscall duckdb::CommitState::CommitEntry(CommitState *this,UndoFlags type,data_ptr_t data)

{
  CatalogType CVar1;
  CatalogEntry *this_00;
  DependencyEntryType DVar2;
  int iVar3;
  undefined4 extraout_var;
  DependencyEntry *this_01;
  CatalogSet *pCVar4;
  CatalogEntry *entry;
  InternalException *this_02;
  UpdateInfo *info;
  DependencyEntry *dep;
  pthread_mutex_t *__mutex;
  allocator local_51;
  string local_50;
  
  switch(type) {
  case CATALOG_ENTRY:
    this_00 = *(CatalogEntry **)data;
    iVar3 = (*this_00->_vptr_CatalogEntry[0xb])(this_00);
    this_01 = (DependencyEntry *)CatalogEntry::Parent(this_00);
    CVar1 = (this_01->super_InCatalogEntry).super_CatalogEntry.type;
    if (CVar1 == DELETED_ENTRY) {
      if ((this_00->set).ptr != (CatalogSet *)0x0) {
        pCVar4 = optional_ptr<duckdb::CatalogSet,_true>::operator->(&this_00->set);
        CatalogSet::CommitDrop(pCVar4,this->commit_id,this->transaction->start_time,this_00);
      }
    }
    else if ((CVar1 == DEPENDENCY_ENTRY) &&
            (DVar2 = DependencyEntry::Side(this_01), DVar2 == SUBJECT)) {
      pCVar4 = optional_ptr<duckdb::CatalogSet,_true>::operator->
                         (&(this_01->super_InCatalogEntry).super_CatalogEntry.set);
      CatalogSet::VerifyExistenceOfDependency(pCVar4,this->commit_id,(CatalogEntry *)this_01);
    }
    __mutex = (pthread_mutex_t *)(CONCAT44(extraout_var,iVar3) + 0x58);
    ::std::mutex::lock((mutex *)&__mutex->__data);
    pCVar4 = optional_ptr<duckdb::CatalogSet,_true>::operator->(&this_00->set);
    ::std::mutex::lock(&pCVar4->catalog_lock);
    entry = CatalogEntry::Parent(this_00);
    CatalogSet::UpdateTimestamp(entry,this->commit_id);
    CommitEntryDrop((CommitState *)entry,this_00,data + 8);
    pthread_mutex_unlock((pthread_mutex_t *)&pCVar4->catalog_lock);
    pthread_mutex_unlock(__mutex);
    return;
  case INSERT_TUPLE:
    DataTable::CommitAppend
              (*(DataTable **)data,this->commit_id,*(idx_t *)(data + 8),*(idx_t *)(data + 0x10));
    return;
  case DELETE_TUPLE:
    RowVersionManager::CommitDelete
              (*(RowVersionManager **)(data + 8),*(idx_t *)(data + 0x10),this->commit_id,
               (DeleteInfo *)data);
    return;
  case UPDATE_TUPLE:
    LOCK();
    *(transaction_t *)(data + 0x10) = this->commit_id;
    UNLOCK();
switchD_01aed32d_caseD_5:
    return;
  case SEQUENCE_VALUE:
    goto switchD_01aed32d_caseD_5;
  default:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"UndoBuffer - don\'t know how to commit this type!",&local_51);
    InternalException::InternalException(this_02,&local_50);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

void CommitState::CommitEntry(UndoFlags type, data_ptr_t data) {
	switch (type) {
	case UndoFlags::CATALOG_ENTRY: {
		auto &old_entry = *Load<CatalogEntry *>(data);
		D_ASSERT(old_entry.HasParent());

		auto &catalog = old_entry.ParentCatalog();
		D_ASSERT(catalog.IsDuckCatalog());

		auto &new_entry = old_entry.Parent();
		if (new_entry.type == CatalogType::DEPENDENCY_ENTRY) {
			auto &dep = new_entry.Cast<DependencyEntry>();
			if (dep.Side() == DependencyEntryType::SUBJECT) {
				new_entry.set->VerifyExistenceOfDependency(commit_id, new_entry);
			}
		} else if (new_entry.type == CatalogType::DELETED_ENTRY && old_entry.set) {
			old_entry.set->CommitDrop(commit_id, transaction.start_time, old_entry);
		}
		// Grab a write lock on the catalog
		auto &duck_catalog = catalog.Cast<DuckCatalog>();
		lock_guard<mutex> write_lock(duck_catalog.GetWriteLock());
		lock_guard<mutex> read_lock(old_entry.set->GetCatalogLock());
		// Set the timestamp of the catalog entry to the given commit_id, marking it as committed
		CatalogSet::UpdateTimestamp(old_entry.Parent(), commit_id);

		// drop any blocks associated with the catalog entry if possible (e.g. in case of a DROP or ALTER)
		CommitEntryDrop(old_entry, data + sizeof(CatalogEntry *));
		break;
	}
	case UndoFlags::INSERT_TUPLE: {
		// append:
		auto info = reinterpret_cast<AppendInfo *>(data);
		// mark the tuples as committed
		info->table->CommitAppend(commit_id, info->start_row, info->count);
		break;
	}
	case UndoFlags::DELETE_TUPLE: {
		// deletion:
		auto info = reinterpret_cast<DeleteInfo *>(data);
		// mark the tuples as committed
		info->version_info->CommitDelete(info->vector_idx, commit_id, *info);
		break;
	}
	case UndoFlags::UPDATE_TUPLE: {
		// update:
		auto info = reinterpret_cast<UpdateInfo *>(data);
		info->version_number = commit_id;
		break;
	}
	case UndoFlags::SEQUENCE_VALUE: {
		break;
	}
	default:
		throw InternalException("UndoBuffer - don't know how to commit this type!");
	}
}